

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCleanupEncodingAliases(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint local_c;
  int mem_base;
  int test_ret;
  
  iVar1 = xmlMemBlocks();
  xmlCleanupEncodingAliases();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    iVar3 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCleanupEncodingAliases",(ulong)(uint)(iVar3 - iVar1));
    printf("\n");
  }
  local_c = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  return local_c;
}

Assistant:

static int
test_xmlCleanupEncodingAliases(void) {
    int test_ret = 0;

    int mem_base;

        mem_base = xmlMemBlocks();

        xmlCleanupEncodingAliases();
        call_tests++;
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCleanupEncodingAliases",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf("\n");
        }
    function_tests++;

    return(test_ret);
}